

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O0

void __thiscall charls::jpeg_stream_reader::read_comment_segment(jpeg_stream_reader *this)

{
  _func_int_void_ptr_unsigned_long_void_ptr *p_Var1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  iterator local_28;
  jpeg_stream_reader *this_local;
  
  if ((this->at_comment_callback_).handler != (_func_int_void_ptr_unsigned_long_void_ptr *)0x0) {
    p_Var1 = (this->at_comment_callback_).handler;
    bVar2 = const_byte_span::empty(&this->segment_data_);
    if (bVar2) {
      local_28 = (iterator)0x0;
    }
    else {
      local_28 = this->position_;
    }
    sVar4 = const_byte_span::size(&this->segment_data_);
    iVar3 = (*p_Var1)(local_28,sVar4,(this->at_comment_callback_).user_context);
    if (iVar3 != 0) {
      impl::throw_jpegls_error(callback_failed);
    }
  }
  skip_remaining_segment_data(this);
  return;
}

Assistant:

void jpeg_stream_reader::read_comment_segment()
{
    if (at_comment_callback_.handler &&
        UNLIKELY(static_cast<bool>(at_comment_callback_.handler(segment_data_.empty() ? nullptr : position_,
                                                                segment_data_.size(), at_comment_callback_.user_context))))
        throw_jpegls_error(jpegls_errc::callback_failed);

    skip_remaining_segment_data();
}